

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::linkEndpoints(CommonCore *this,string_view source,string_view dest)

{
  ActionMessage link;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_endpoint_link);
  ActionMessage::name(&AStack_e8,source);
  ActionMessage::setStringData(&AStack_e8,dest);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::linkEndpoints(std::string_view source, std::string_view dest)
{
    ActionMessage link(CMD_ENDPOINT_LINK);
    link.name(source);
    link.setStringData(dest);
    addActionMessage(std::move(link));
}